

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O0

int check_posix_name(PCRE2_SPTR8 ptr,int len)

{
  int iVar1;
  int local_2c;
  char *pcStack_28;
  int yield;
  char *pn;
  int len_local;
  PCRE2_SPTR8 ptr_local;
  
  pcStack_28 = "alpha";
  local_2c = 0;
  while( true ) {
    if ("\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x04\x06"[local_2c] == '\0') {
      return -1;
    }
    if ((len == (uint)"\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x04\x06"[local_2c]) &&
       (iVar1 = _pcre2_strncmp_c8_8(ptr,pcStack_28,(ulong)(uint)len), iVar1 == 0)) break;
    pcStack_28 = pcStack_28 +
                 (int)("\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x04\x06"[local_2c] + 1);
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

static int
check_posix_name(PCRE2_SPTR ptr, int len)
{
const char *pn = posix_names;
register int yield = 0;
while (posix_name_lengths[yield] != 0)
  {
  if (len == posix_name_lengths[yield] &&
    PRIV(strncmp_c8)(ptr, pn, (unsigned int)len) == 0) return yield;
  pn += posix_name_lengths[yield] + 1;
  yield++;
  }
return -1;
}